

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_gather.c
# Opt level: O0

REF_STATUS ref_gather_volume_status_tec(REF_GRID ref_grid,char *filename)

{
  uint uVar1;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i;
  REF_INT ldim;
  char *vars [2];
  double local_50;
  REF_DBL edge_ratio;
  REF_DBL *scalar;
  REF_EDGE ref_edge;
  int local_30;
  REF_INT node1;
  REF_INT node0;
  REF_INT edge;
  REF_NODE ref_node;
  char *filename_local;
  REF_GRID ref_grid_local;
  
  _node0 = ref_grid->node;
  _ref_malloc_init_i = "s";
  vars[0] = "l";
  ref_node = (REF_NODE)filename;
  filename_local = (char *)ref_grid;
  if (_node0->max * 2 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",0x119f
           ,"ref_gather_volume_status_tec","malloc scalar of REF_DBL negative");
    ref_grid_local._4_4_ = 1;
  }
  else {
    edge_ratio = (REF_DBL)malloc((long)(_node0->max * 2) << 3);
    if ((void *)edge_ratio == (void *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
             0x119f,"ref_gather_volume_status_tec","malloc scalar of REF_DBL NULL");
      ref_grid_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < _node0->max * 2;
          ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
        *(undefined8 *)((long)edge_ratio + (long)ref_private_macro_code_rss_1 * 8) =
             0x3ff0000000000000;
      }
      uVar1 = ref_edge_create((REF_EDGE *)&scalar,(REF_GRID)filename_local);
      if (uVar1 == 0) {
        for (node1 = 0; node1 < *(int *)scalar; node1 = node1 + 1) {
          local_30 = *(REF_INT *)((long)scalar[1] + (long)(node1 << 1) * 4);
          ref_edge._4_4_ = *(REF_INT *)((long)scalar[1] + (long)(node1 * 2 + 1) * 4);
          uVar1 = ref_node_ratio(_node0,local_30,ref_edge._4_4_,&local_50);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x11a4,"ref_gather_volume_status_tec",(ulong)uVar1,"ratio");
            return uVar1;
          }
          if (local_50 <= *(double *)((long)edge_ratio + (long)(local_30 * 2) * 8)) {
            local_88 = local_50;
          }
          else {
            local_88 = *(double *)((long)edge_ratio + (long)(local_30 * 2) * 8);
          }
          *(double *)((long)edge_ratio + (long)(local_30 * 2) * 8) = local_88;
          if (local_50 <= *(double *)((long)edge_ratio + (long)(ref_edge._4_4_ * 2) * 8)) {
            local_90 = local_50;
          }
          else {
            local_90 = *(double *)((long)edge_ratio + (long)(ref_edge._4_4_ * 2) * 8);
          }
          *(double *)((long)edge_ratio + (long)(ref_edge._4_4_ * 2) * 8) = local_90;
          if (*(double *)((long)edge_ratio + (long)(local_30 * 2 + 1) * 8) <= local_50) {
            local_98 = local_50;
          }
          else {
            local_98 = *(double *)((long)edge_ratio + (long)(local_30 * 2 + 1) * 8);
          }
          *(double *)((long)edge_ratio + (long)(local_30 * 2 + 1) * 8) = local_98;
          if (*(double *)((long)edge_ratio + (long)(ref_edge._4_4_ * 2 + 1) * 8) <= local_50) {
            local_a0 = local_50;
          }
          else {
            local_a0 = *(double *)((long)edge_ratio + (long)(ref_edge._4_4_ * 2 + 1) * 8);
          }
          *(double *)((long)edge_ratio + (long)(ref_edge._4_4_ * 2 + 1) * 8) = local_a0;
        }
        uVar1 = ref_edge_free((REF_EDGE)scalar);
        if (uVar1 == 0) {
          uVar1 = ref_gather_scalar_by_extension
                            ((REF_GRID)filename_local,2,(REF_DBL *)edge_ratio,
                             (char **)&ref_malloc_init_i,(char *)ref_node);
          if (uVar1 == 0) {
            if (edge_ratio != 0.0) {
              free((void *)edge_ratio);
            }
            ref_grid_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c"
                   ,0x11ad,"ref_gather_volume_status_tec",(ulong)uVar1,"dump");
            ref_grid_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
                 0x11aa,"ref_gather_volume_status_tec",(ulong)uVar1,"free edges");
          ref_grid_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_gather.c",
               0x11a0,"ref_gather_volume_status_tec",(ulong)uVar1,"create edges");
        ref_grid_local._4_4_ = uVar1;
      }
    }
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_gather_volume_status_tec(REF_GRID ref_grid,
                                                const char *filename) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT edge, node0, node1;
  REF_EDGE ref_edge;
  REF_DBL *scalar, edge_ratio;
  const char *vars[2];
  REF_INT ldim = 2;

  vars[0] = "s";
  vars[1] = "l";
  ref_malloc_init(scalar, ldim * ref_node_max(ref_node), REF_DBL, 1.0);
  RSS(ref_edge_create(&ref_edge, ref_grid), "create edges");
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    node0 = ref_edge_e2n(ref_edge, 0, edge);
    node1 = ref_edge_e2n(ref_edge, 1, edge);
    RSS(ref_node_ratio(ref_node, node0, node1, &edge_ratio), "ratio");
    scalar[0 + ldim * node0] = MIN(scalar[0 + ldim * node0], edge_ratio);
    scalar[0 + ldim * node1] = MIN(scalar[0 + ldim * node1], edge_ratio);
    scalar[1 + ldim * node0] = MAX(scalar[1 + ldim * node0], edge_ratio);
    scalar[1 + ldim * node1] = MAX(scalar[1 + ldim * node1], edge_ratio);
  }
  RSS(ref_edge_free(ref_edge), "free edges");

  RSS(ref_gather_scalar_by_extension(ref_grid, ldim, scalar, vars, filename),
      "dump");

  ref_free(scalar);

  return REF_SUCCESS;
}